

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O0

int32_t unistrTextReplace(UText *ut,int64_t start,int64_t limit,UChar *src,int32_t length,
                         UErrorCode *pErrorCode)

{
  int start_00;
  UnicodeString *this;
  UBool UVar1;
  int _length;
  int32_t iVar2;
  char16_t *pcVar3;
  int32_t lengthDelta;
  int32_t newLength;
  ConstChar16Ptr local_60;
  int32_t local_54;
  int local_50;
  int32_t limit32;
  int32_t start32;
  int32_t oldLength;
  UnicodeString *us;
  UErrorCode *pErrorCode_local;
  UChar *pUStack_30;
  int32_t length_local;
  UChar *src_local;
  int64_t limit_local;
  int64_t start_local;
  UText *ut_local;
  
  _start32 = (UnicodeString *)ut->context;
  us = (UnicodeString *)pErrorCode;
  pErrorCode_local._4_4_ = length;
  pUStack_30 = src;
  src_local = (UChar *)limit;
  limit_local = start;
  start_local = (int64_t)ut;
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    if ((pUStack_30 == (UChar *)0x0) && (pErrorCode_local._4_4_ != 0)) {
      *(undefined4 *)&(us->super_Replaceable).super_UObject._vptr_UObject = 1;
    }
    if ((long)src_local < limit_local) {
      *(undefined4 *)&(us->super_Replaceable).super_UObject._vptr_UObject = 8;
      ut_local._4_4_ = 0;
    }
    else {
      limit32 = icu_63::UnicodeString::length(_start32);
      local_50 = pinIndex(&limit_local,(long)limit32);
      local_54 = pinIndex((int64_t *)&src_local,(long)limit32);
      if (local_50 < limit32) {
        local_50 = icu_63::UnicodeString::getChar32Start(_start32,local_50);
      }
      if (local_54 < limit32) {
        local_54 = icu_63::UnicodeString::getChar32Start(_start32,local_54);
      }
      this = _start32;
      start_00 = local_50;
      _length = local_54 - local_50;
      icu_63::ConstChar16Ptr::ConstChar16Ptr(&local_60,pUStack_30);
      icu_63::UnicodeString::replace(this,start_00,_length,&local_60,pErrorCode_local._4_4_);
      icu_63::ConstChar16Ptr::~ConstChar16Ptr(&local_60);
      iVar2 = icu_63::UnicodeString::length(_start32);
      pcVar3 = icu_63::UnicodeString::getBuffer(_start32);
      *(char16_t **)(start_local + 0x30) = pcVar3;
      *(int32_t *)(start_local + 0x2c) = iVar2;
      *(long *)(start_local + 0x10) = (long)iVar2;
      *(int32_t *)(start_local + 0x1c) = iVar2;
      ut_local._4_4_ = iVar2 - limit32;
      *(int32_t *)(start_local + 0x28) = local_54 + ut_local._4_4_;
    }
  }
  else {
    ut_local._4_4_ = 0;
  }
  return ut_local._4_4_;
}

Assistant:

static int32_t U_CALLCONV
unistrTextReplace(UText *ut,
                  int64_t start, int64_t limit,
                  const UChar *src, int32_t length,
                  UErrorCode *pErrorCode) {
    UnicodeString *us=(UnicodeString *)ut->context;
    int32_t oldLength;

    if(U_FAILURE(*pErrorCode)) {
        return 0;
    }
    if(src==NULL && length!=0) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
    }
    if(start>limit) {
        *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
    }
    oldLength=us->length();
    int32_t start32 = pinIndex(start, oldLength);
    int32_t limit32 = pinIndex(limit, oldLength);
    if (start32 < oldLength) {
        start32 = us->getChar32Start(start32);
    }
    if (limit32 < oldLength) {
        limit32 = us->getChar32Start(limit32);
    }

    // replace
    us->replace(start32, limit32-start32, src, length);
    int32_t newLength = us->length();

    // Update the chunk description.
    ut->chunkContents    = us->getBuffer();
    ut->chunkLength      = newLength;
    ut->chunkNativeLimit = newLength;
    ut->nativeIndexingLimit = newLength;

    // Set iteration position to the point just following the newly inserted text.
    int32_t lengthDelta = newLength - oldLength;
    ut->chunkOffset = limit32 + lengthDelta;

    return lengthDelta;
}